

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_ReleaseMessage_Test::TestBody(ArenaTest_ReleaseMessage_Test *this)

{
  byte *pbVar1;
  long lVar2;
  void *pvVar3;
  void *pvVar4;
  TestAllTypes_NestedMessage *message;
  MessageLite *message_00;
  ulong uVar5;
  pointer *__ptr;
  Arena *arena_00;
  char *pcVar6;
  AssertionResult gtest_ar;
  unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
  nested;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  _Head_base<0UL,_proto2_unittest::TestAllTypes_NestedMessage_*,_false> local_b8;
  ThreadSafeArena local_b0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  pvVar3 = Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_b0);
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) | 0x20;
  if (*(long *)((long)pvVar3 + 0x220) == 0) {
    arena_00 = *(Arena **)((long)pvVar3 + 8);
    if (((ulong)arena_00 & 1) != 0) {
      arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
    }
    pvVar4 = Arena::DefaultConstruct<proto2_unittest::TestAllTypes_NestedMessage>(arena_00);
    *(void **)((long)pvVar3 + 0x220) = pvVar4;
  }
  lVar2 = *(long *)((long)pvVar3 + 0x220);
  *(undefined4 *)(lVar2 + 0x18) = 0x76;
  pbVar1 = (byte *)(lVar2 + 0x10);
  *pbVar1 = *pbVar1 | 1;
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) & 0xdf;
  message = *(TestAllTypes_NestedMessage **)((long)pvVar3 + 0x220);
  *(undefined8 *)((long)pvVar3 + 0x220) = 0;
  uVar5 = *(ulong *)((long)pvVar3 + 8);
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  if (uVar5 != 0) {
    message = (TestAllTypes_NestedMessage *)
              protobuf::internal::DuplicateIfNonNullInternal((MessageLite *)message);
  }
  local_d8._M_head_impl._0_4_ = 0x76;
  local_d0.data_._0_4_ = *(undefined4 *)((long)&message->field_0 + 8);
  local_b8._M_head_impl = message;
  testing::internal::CmpHelperEQ<int,int>
            (local_c8,"118","nested->bb()",(int *)&local_d8,(int *)&local_d0);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar6 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x309,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  *(byte *)((long)pvVar3 + 0x10) = *(byte *)((long)pvVar3 + 0x10) & 0xdf;
  message_00 = *(MessageLite **)((long)pvVar3 + 0x220);
  *(undefined8 *)((long)pvVar3 + 0x220) = 0;
  uVar5 = *(ulong *)((long)pvVar3 + 8);
  if ((uVar5 & 1) != 0) {
    uVar5 = *(ulong *)(uVar5 & 0xfffffffffffffffe);
  }
  if (uVar5 != 0) {
    message_00 = protobuf::internal::DuplicateIfNonNullInternal(message_00);
  }
  local_d0.data_ = (AssertHelperData *)0x0;
  local_d8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)message_00;
  testing::internal::
  CmpHelperEQ<proto2_unittest::TestAllTypes_NestedMessage*,proto2_unittest::TestAllTypes_NestedMessage*>
            (local_c8,"nullptr","released_null",(TestAllTypes_NestedMessage **)&local_d0,
             (TestAllTypes_NestedMessage **)&local_d8);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar6 = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x30d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if ((MessageLite *)local_d8._M_head_impl != (MessageLite *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  std::
  unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
  ::~unique_ptr((unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
                 *)&local_b8);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(ArenaTest, ReleaseMessage) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->mutable_optional_nested_message()->set_bb(118);
  std::unique_ptr<TestAllTypes::NestedMessage> nested(
      arena_message->release_optional_nested_message());
  EXPECT_EQ(118, nested->bb());

  TestAllTypes::NestedMessage* released_null =
      arena_message->release_optional_nested_message();
  EXPECT_EQ(nullptr, released_null);
}